

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNames.c
# Opt level: O2

void Abc_NtkAddDummyPoNames(Abc_Ntk_t *pNtk)

{
  int nDigits;
  Abc_Obj_t *pObj;
  uint n;
  int i;
  
  n = pNtk->vPos->nSize;
  nDigits = Abc_Base10Log(n);
  for (i = 0; i < (int)n; i = i + 1) {
    pObj = Abc_NtkPo(pNtk,i);
    Abc_ObjNameDummy("po",i,nDigits);
    Abc_ObjAssignName(pObj,Abc_ObjNameDummy::Buffer,(char *)0x0);
    n = pNtk->vPos->nSize;
  }
  return;
}

Assistant:

void Abc_NtkAddDummyPoNames( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pObj;
    int nDigits, i;
    nDigits = Abc_Base10Log( Abc_NtkPoNum(pNtk) );
    Abc_NtkForEachPo( pNtk, pObj, i )
        Abc_ObjAssignName( pObj, Abc_ObjNameDummy("po", i, nDigits), NULL );
}